

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::TypedExpectation<void_(int,_int)>::ShouldHandleArguments
          (TypedExpectation<void_(int,_int)> *this,ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  TypedExpectation<void_(int,_int)> *this_local;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  ExpectationBase::CheckActionCountIfNotDone((ExpectationBase *)this);
  bVar1 = ExpectationBase::is_retired((ExpectationBase *)this);
  local_19 = false;
  if (!bVar1) {
    bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied((ExpectationBase *)this);
    local_19 = false;
    if (bVar1) {
      local_19 = Matches(this,args);
    }
  }
  return local_19;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // In case the action count wasn't checked when the expectation
    // was defined (e.g. if this expectation has no WillRepeatedly()
    // or RetiresOnSaturation() clause), we check it when the
    // expectation is used for the first time.
    CheckActionCountIfNotDone();
    return !is_retired() && AllPrerequisitesAreSatisfied() && Matches(args);
  }